

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_engine.hpp
# Opt level: O0

void cppurses::detail::Event_engine::send_all_deletes(Event_queue *queue)

{
  bool bVar1;
  pointer this;
  Widget *receiver_00;
  type event_00;
  Widget *receiver;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> event;
  undefined1 local_b0 [8];
  Move_iterator __end2;
  Move_iterator __begin2;
  View<(cppurses::Event::Type)19> *__range2;
  View<(cppurses::Event::Type)19> view;
  Event_queue *queue_local;
  
  view.queue_ = queue;
  Event_queue::View<(cppurses::Event::Type)19>::View
            ((View<(cppurses::Event::Type)19> *)&__range2,queue);
  Event_queue::View<(cppurses::Event::Type)19>::begin
            ((Move_iterator *)&__end2.at_,(View<(cppurses::Event::Type)19> *)&__range2);
  Event_queue::View<(cppurses::Event::Type)19>::end
            ((Move_iterator *)local_b0,(View<(cppurses::Event::Type)19> *)&__range2);
  while( true ) {
    bVar1 = Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator!=
                      ((Move_iterator *)&__end2.at_,(Move_iterator *)local_b0);
    if (!bVar1) break;
    Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator*
              ((Move_iterator *)&receiver);
    this = std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::operator->
                     ((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)
                      &receiver);
    receiver_00 = Event::receiver(this);
    event_00 = std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::operator*
                         ((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)
                          &receiver);
    System::send_event(event_00);
    Event_queue::remove_events_of(view.queue_,receiver_00);
    std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr
              ((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)&receiver);
    Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::operator++
              ((Move_iterator *)&__end2.at_);
  }
  Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::~Move_iterator
            ((Move_iterator *)local_b0);
  Event_queue::View<(cppurses::Event::Type)19>::Move_iterator::~Move_iterator
            ((Move_iterator *)&__end2.at_);
  return;
}

Assistant:

static auto send_all_deletes(Event_queue& queue) -> void
    {
        auto view = Event_queue::View<Event::Delete>{queue};
        for (std::unique_ptr<Event> event : view) {
            Widget* receiver = &(event->receiver());
            System::send_event(*event);
            queue.remove_events_of(receiver);
        }
    }